

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O0

void __thiscall
ShadingWriter::WriteColorInterpolation
          (ShadingWriter *this,IByteWriter *inWriter,PrimitiveObjectsWriter *inPrimitiveWriter,
          FT_Byte inColorStart,FT_Byte inColorEnd,double inStopDiff)

{
  PrimitiveObjectsWriter *pPVar1;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  double local_30;
  double inStopDiff_local;
  FT_Byte inColorEnd_local;
  PrimitiveObjectsWriter *pPStack_20;
  FT_Byte inColorStart_local;
  PrimitiveObjectsWriter *inPrimitiveWriter_local;
  IByteWriter *inWriter_local;
  ShadingWriter *this_local;
  
  local_30 = inStopDiff;
  inStopDiff_local._6_1_ = inColorEnd;
  inStopDiff_local._7_1_ = inColorStart;
  pPStack_20 = inPrimitiveWriter;
  inPrimitiveWriter_local = (PrimitiveObjectsWriter *)inWriter;
  inWriter_local = (IByteWriter *)this;
  if (inColorEnd == inColorStart) {
    PrimitiveObjectsWriter::WriteDouble
              (inPrimitiveWriter,(double)inColorEnd / 255.0,eTokenSeparatorSpace);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"dup ",&local_51);
    WriteStreamText(this,inWriter,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    PrimitiveObjectsWriter::WriteDouble
              (pPStack_20,
               (double)(int)((uint)inStopDiff_local._6_1_ - (uint)inStopDiff_local._7_1_) /
               (local_30 * 255.0),eTokenSeparatorSpace);
    pPVar1 = inPrimitiveWriter_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"mul ",&local_89);
    WriteStreamText(this,(IByteWriter *)pPVar1,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
    PrimitiveObjectsWriter::WriteDouble
              (pPStack_20,(double)inStopDiff_local._7_1_ / 255.0,eTokenSeparatorSpace);
    pPVar1 = inPrimitiveWriter_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"add ",&local_b1);
    WriteStreamText(this,(IByteWriter *)pPVar1,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  }
  pPVar1 = inPrimitiveWriter_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"exch ",&local_d9);
  WriteStreamText(this,(IByteWriter *)pPVar1,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  return;
}

Assistant:

void ShadingWriter::WriteColorInterpolation(
    IByteWriter* inWriter,
    PrimitiveObjectsWriter* inPrimitiveWriter,
    FT_Byte inColorStart, 
    FT_Byte inColorEnd, 
    double inStopDiff) {
    if(inColorEnd == inColorStart) {
        // same color...so just put it there
        inPrimitiveWriter->WriteDouble(inColorEnd/255.0);
    } else {
        // interpolate
        WriteStreamText(inWriter, "dup ");
        inPrimitiveWriter->WriteDouble((inColorEnd - inColorStart)/(inStopDiff*255.0));
        WriteStreamText(inWriter, "mul ");
        inPrimitiveWriter->WriteDouble(inColorStart/255.0);
        WriteStreamText(inWriter, "add ");
    }
    WriteStreamText(inWriter, "exch ");
}